

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

bool __thiscall slang::ast::Type::isValidForSequence(Type *this)

{
  bool bVar1;
  Type *this_00;
  Type *ct;
  undefined1 local_11;
  Type *in_stack_fffffffffffffff0;
  
  this_00 = getCanonicalType(in_stack_fffffffffffffff0);
  bVar1 = isIntegral(this_00);
  local_11 = true;
  if (!bVar1) {
    bVar1 = isString((Type *)0x4e5e99);
    local_11 = true;
    if (!bVar1) {
      local_11 = isFloating((Type *)0x4e5eb0);
    }
  }
  return local_11;
}

Assistant:

bool Type::isValidForSequence() const {
    // Type must be cast compatible with an integral type to be valid.
    auto& ct = getCanonicalType();
    return ct.isIntegral() || ct.isString() || ct.isFloating();
}